

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

double fitted(reg_object obj,double *inp,double *varcovar,double *var)

{
  size_t __size;
  double dVar1;
  double dVar2;
  int n;
  double *C;
  double *A;
  double *B;
  double *C_00;
  long lVar3;
  
  n = obj->p;
  C = (double *)malloc(8);
  __size = (long)n * 8;
  A = (double *)malloc(__size);
  B = (double *)malloc(__size);
  C_00 = (double *)malloc(__size);
  if (obj->intercept == 1) {
    *A = 1.0;
    *B = obj->beta[0].value;
    if (1 < n) {
      memcpy(A + 1,inp,(ulong)(n - 1) << 3);
      lVar3 = 0;
      do {
        *(undefined8 *)((long)B + lVar3 + 8) = *(undefined8 *)((long)obj[1].R2 + lVar3 * 4 + -0x38);
        lVar3 = lVar3 + 8;
      } while ((long)n * 8 + -8 != lVar3);
    }
  }
  else if (0 < n) {
    memcpy(A,inp,__size);
    lVar3 = 0;
    do {
      *(undefined8 *)((long)B + lVar3) = *(undefined8 *)((long)&obj->beta[0].value + lVar3 * 4);
      lVar3 = lVar3 + 8;
    } while (__size - lVar3 != 0);
  }
  mmult(A,B,C,1,n,1);
  dVar1 = *C;
  mmult(A,varcovar,C_00,1,n,n);
  mmult(C_00,A,C,1,n,1);
  dVar2 = *C;
  *var = dVar2;
  var[1] = dVar2 + obj->sigma;
  free(C_00);
  free(C);
  free(A);
  free(B);
  return dVar1;
}

Assistant:

double fitted(reg_object obj, double *inp, double *varcovar, double *var) {
	int i, p;
	double oup;
	double *y, *x0, *b, *temp;
	/*
	* The function predicts output value at a given input point (vector of size p-1)
	*
	* inp - ia a  vector of length p-1 values corresponding to each of the p-1
	* dependent variables.
	* The function returns output value corresponding to the input inp vector of length (p-1).
	*
	* varcovar - Is the Aurovariance-Covariance matrix that is obtained from the regression function
	* var - is a vector of length 2 where
	* var[0] - Variance of Mean Prediction
	* var[1] - Variance Of Individual Prediction
	*
	*/
	p = obj->p;
	y = (double*)malloc(sizeof(double) * 1);
	x0 = (double*)malloc(sizeof(double) * p);
	b = (double*)malloc(sizeof(double) * p);
	temp = (double*)malloc(sizeof(double) * p);

	if (obj->intercept == 1) {
		x0[0] = 1.0;

		b[0] = (obj->beta)->value;

		for (i = 1; i < p; ++i) {
			x0[i] = inp[i - 1];
			b[i] = (obj->beta + i)->value;
		}
	}
	else {

		for (i = 0; i < p; ++i) {
			x0[i] = inp[i];
			b[i] = (obj->beta + i)->value;
		}
	}


	// Output
	mmult(x0, b, y, 1, p, 1);
	oup = *y;

	// Variance Of Mean Prediction
	mmult(x0, varcovar, temp, 1, p, p);
	mmult(temp, x0, y, 1, p, 1);
	var[0] = *y;

	// Variance Of Individual prediction
	var[1] = obj->sigma + var[0];

	free(temp);
	free(y);
	free(x0);
	free(b);
	return oup;
}